

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

size_t __thiscall Assimp::CFIReaderImpl::parseNonEmptyOctetString7Length(CFIReaderImpl *this)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  DeadlyImportError *this_00;
  long lVar4;
  
  pbVar1 = this->dataP;
  this->dataP = pbVar1 + 1;
  bVar2 = (byte)(*pbVar1 & 3);
  if (bVar2 < 2) {
    sVar3 = (ulong)(*pbVar1 & 3) + 1;
  }
  else {
    lVar4 = (long)this->dataEnd - (long)(pbVar1 + 1);
    if (bVar2 == 2) {
      if (lVar4 < 1) {
LAB_0053a7bf:
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this->dataP = pbVar1 + 2;
      sVar3 = (ulong)pbVar1[1] + 3;
    }
    else {
      if (lVar4 < 4) goto LAB_0053a7bf;
      sVar3 = (ulong)pbVar1[4] +
              ((ulong)pbVar1[3] << 8 |
              (long)(int)((uint)pbVar1[1] << 0x18) | (ulong)pbVar1[2] << 0x10) + 0x103;
      this->dataP = pbVar1 + 5;
    }
  }
  return sVar3;
}

Assistant:

size_t parseNonEmptyOctetString7Length() { // C.24
        // Parse the length of the string
        size_t b = *dataP++ & 0x03;
        if (!(b & 0x02)) { // xxxxxx0. (C.24.3.1)
            return b + 1;
        }
        else if (b == 0x02) { // xxxxxx10 ........ (C.24.3.2)
            if (dataEnd - dataP > 0) {
                return *dataP++ + 0x3;
            }
        }
        else if (b == 0x03) { // xxxxxx11 ........ ........ ........ ........ (C.24.3.3)
            if (dataEnd - dataP > 3) {
                size_t result = ((dataP[0] << 24) | (dataP[1] << 16) | (dataP[2] << 8) | dataP[3]) + 0x103;
                dataP += 4;
                return result;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }